

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffers_1
asio::buffer<char,std::allocator<char>>
          (vector<char,_std::allocator<char>_> *data,size_t max_size_in_bytes)

{
  size_type sVar1;
  void *pvVar2;
  void *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  mutable_buffers_1 *local_28;
  mutable_buffer local_10;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size(in_RDI);
  if (sVar1 == 0) {
    local_28 = (mutable_buffers_1 *)0x0;
  }
  else {
    local_28 = (mutable_buffers_1 *)std::vector<char,_std::allocator<char>_>::operator[](in_RDI,0);
  }
  pvVar2 = (void *)std::vector<char,_std::allocator<char>_>::size(in_RDI);
  if (pvVar2 < in_RSI) {
    in_RSI = (void *)std::vector<char,_std::allocator<char>_>::size(in_RDI);
  }
  mutable_buffers_1::mutable_buffers_1(local_28,in_RSI,0x7d842b);
  return (mutable_buffers_1)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_MUTABLE_BUFFER buffer(
    std::vector<PodType, Allocator>& data,
    std::size_t max_size_in_bytes) noexcept
{
  return ASIO_MUTABLE_BUFFER(data.size() ? &data[0] : 0,
      data.size() * sizeof(PodType) < max_size_in_bytes
      ? data.size() * sizeof(PodType) : max_size_in_bytes
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , detail::buffer_debug_check<
          typename std::vector<PodType, Allocator>::iterator
        >(data.begin())
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}